

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlHashedString xmlParseNCName(xmlParserCtxtPtr ctxt)

{
  int *piVar1;
  byte bVar2;
  xmlParserInputPtr pxVar3;
  byte *name;
  byte *pbVar4;
  xmlChar *pxVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  undefined8 in_RAX;
  ulong uVar10;
  undefined4 uVar11;
  byte *pbVar12;
  ulong uVar13;
  xmlChar *pxVar14;
  ulong unaff_R15;
  xmlHashedString xVar15;
  undefined8 local_38;
  
  uVar10 = 10000000;
  if (((uint)ctxt->options >> 0x13 & 1) == 0) {
    uVar10 = 50000;
  }
  pxVar3 = ctxt->input;
  name = pxVar3->cur;
  pbVar4 = pxVar3->end;
  local_38 = in_RAX;
  if ((byte)((*name & 0xdf) + 0xbf) < 0x1a) {
    if (name < pbVar4) goto LAB_00143c50;
LAB_00143cdc:
    uVar11 = 10000000;
    if (((uint)ctxt->options >> 0x13 & 1) == 0) {
      uVar11 = 50000;
    }
    pxVar5 = pxVar3->base;
    uVar7 = xmlCurrentChar(ctxt,(int *)&local_38);
    if ((0x3e < uVar7) || ((0x4000800100000000U >> ((ulong)uVar7 & 0x3f) & 1) == 0)) {
      iVar8 = xmlIsNameStartChar(ctxt,uVar7);
      unaff_R15 = 0;
      if (uVar7 != 0x3a) {
        pxVar14 = (xmlChar *)0x0;
        if (iVar8 == 0) goto LAB_00143d1d;
        local_38 = CONCAT44(uVar11,(uint)local_38);
        iVar8 = 0;
        while ((((0x3e < uVar7 || ((0x4000800100000000U >> ((ulong)uVar7 & 0x3f) & 1) == 0)) &&
                (iVar9 = xmlIsNameChar(ctxt,uVar7), uVar7 != 0x3a)) && (iVar9 != 0))) {
          uVar7 = (uint)local_38;
          if ((int)((uint)local_38 ^ 0x7fffffff) < iVar8) {
            uVar7 = 0;
          }
          pxVar3 = ctxt->input;
          if (*pxVar3->cur == '\n') {
            pxVar3->line = pxVar3->line + 1;
            pxVar3->col = 1;
          }
          else {
            pxVar3->col = pxVar3->col + 1;
          }
          iVar8 = iVar8 + uVar7;
          pxVar3->cur = pxVar3->cur + (int)(uint)local_38;
          uVar7 = xmlCurrentChar(ctxt,(int *)&local_38);
        }
        if (iVar8 <= local_38._4_4_) {
          xVar15 = xmlDictLookupHashed(ctxt->dict,ctxt->input->base + ((long)name - (long)pxVar5),
                                       iVar8);
          pxVar14 = xVar15.name;
          uVar7 = xVar15.hashValue;
          goto LAB_00143e3b;
        }
        xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"NCName");
      }
    }
    unaff_R15 = 0;
    pxVar14 = (xmlChar *)0x0;
  }
  else {
    if (*name != 0x5f || pbVar4 <= name) goto LAB_00143cdc;
LAB_00143c50:
    uVar6 = 1;
    pbVar12 = name;
    do {
      uVar13 = uVar6;
      pbVar12 = pbVar12 + 1;
      bVar2 = *pbVar12;
      if (((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) &&
         ((0x32 < bVar2 - 0x2d || ((0x4000000000003U >> ((ulong)(bVar2 - 0x2d) & 0x3f) & 1) == 0))))
      break;
      uVar6 = uVar13 + 1;
    } while (pbVar12 < pbVar4);
    if ((char)bVar2 < '\x01' || pbVar4 <= pbVar12) goto LAB_00143cdc;
    if (uVar10 < uVar13) {
      xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"NCName");
      pxVar14 = (xmlChar *)0x0;
      goto LAB_00143d1d;
    }
    xVar15 = xmlDictLookupHashed(ctxt->dict,name,(int)uVar13);
    pxVar14 = xVar15.name;
    uVar7 = xVar15.hashValue;
    pxVar3 = ctxt->input;
    pxVar3->cur = pbVar12;
    piVar1 = &pxVar3->col;
    *piVar1 = *piVar1 + (int)uVar13;
LAB_00143e3b:
    unaff_R15 = (ulong)uVar7;
    if (pxVar14 == (xmlChar *)0x0) {
      xmlCtxtErrMemory(ctxt);
    }
  }
LAB_00143d1d:
  xVar15._0_8_ = unaff_R15 & 0xffffffff;
  xVar15.name = pxVar14;
  return xVar15;
}

Assistant:

static xmlHashedString
xmlParseNCName(xmlParserCtxtPtr ctxt) {
    const xmlChar *in, *e;
    xmlHashedString ret;
    size_t count = 0;
    size_t maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                       XML_MAX_TEXT_LENGTH :
                       XML_MAX_NAME_LENGTH;

    ret.name = NULL;

    /*
     * Accelerator for simple ASCII names
     */
    in = ctxt->input->cur;
    e = ctxt->input->end;
    if ((((*in >= 0x61) && (*in <= 0x7A)) ||
	 ((*in >= 0x41) && (*in <= 0x5A)) ||
	 (*in == '_')) && (in < e)) {
	in++;
	while ((((*in >= 0x61) && (*in <= 0x7A)) ||
	        ((*in >= 0x41) && (*in <= 0x5A)) ||
	        ((*in >= 0x30) && (*in <= 0x39)) ||
	        (*in == '_') || (*in == '-') ||
	        (*in == '.')) && (in < e))
	    in++;
	if (in >= e)
	    goto complex;
	if ((*in > 0) && (*in < 0x80)) {
	    count = in - ctxt->input->cur;
            if (count > maxLength) {
                xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NCName");
                return(ret);
            }
	    ret = xmlDictLookupHashed(ctxt->dict, ctxt->input->cur, count);
	    ctxt->input->cur = in;
	    ctxt->input->col += count;
	    if (ret.name == NULL) {
	        xmlErrMemory(ctxt);
	    }
	    return(ret);
	}
    }
complex:
    return(xmlParseNCNameComplex(ctxt));
}